

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

event_queue_t * __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::create_thread_for_agent
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *this,agent_t *agent)

{
  anon_class_24_3_f9d96878 main_action;
  iterator iVar1;
  exception_t *peVar2;
  shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
  thread;
  lock_factory_t lock_factory;
  
  std::mutex::lock(&this->m_lock);
  if (this->m_shutdown_started == true) {
    peVar2 = (exception_t *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string
              ((string *)&lock_factory,"shutdown was initiated",(allocator *)&thread);
    exception_t::exception_t(peVar2,(string *)&lock_factory,0x1f);
    __cxa_throw(peVar2,&exception_t::typeinfo,exception_t::~exception_t);
  }
  lock_factory.super__Function_base._M_functor._M_unused._M_object = agent;
  iVar1 = std::
          _Rb_tree<const_so_5::agent_t_*,_std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>_>,_std::_Select1st<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>_>_>,_std::less<const_so_5::agent_t_*>,_std::allocator<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>_>_>_>
          ::find(&(this->m_agent_threads)._M_t,(key_type *)&lock_factory);
  if (&(this->m_agent_threads)._M_t._M_impl.super__Rb_tree_header ==
      (_Rb_tree_header *)iVar1._M_node) {
    std::
    function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
    ::function(&lock_factory,&(this->m_params).m_queue_params.m_lock_factory);
    std::
    make_shared<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,std::function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>>()>>
              ((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                *)&thread);
    reuse::work_thread::details::
    work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>::
    start((work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
           *)thread.
             super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
    main_action.agent = agent;
    main_action.this = this;
    main_action.thread = &thread;
    details::
    do_with_rollback_on_exception<so_5::disp::active_obj::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::create_thread_for_agent(so_5::agent_t_const&)::_lambda()_1_,so_5::disp::active_obj::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::create_thread_for_agent(so_5::agent_t_const&)::_lambda()_2_>
              (main_action,&thread);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&thread.
                super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::_Function_base::~_Function_base(&lock_factory.super__Function_base);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
    return &((thread.
              super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_activity_tracking_impl_t).
            super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
            .m_queue.super_event_queue_t;
  }
  peVar2 = (exception_t *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string
            ((string *)&lock_factory,"thread for the agent is already exists",(allocator *)&thread);
  exception_t::exception_t(peVar2,(string *)&lock_factory,0x1f);
  __cxa_throw(peVar2,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

virtual event_queue_t *
		create_thread_for_agent( const agent_t & agent ) override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				if( m_shutdown_started )
					throw so_5::exception_t(
						"shutdown was initiated",
						rc_disp_create_failed );

				if( m_agent_threads.end() != m_agent_threads.find( &agent ) )
					throw so_5::exception_t(
						"thread for the agent is already exists",
						rc_disp_create_failed );

				auto lock_factory = m_params.queue_params().lock_factory();
				auto thread = std::make_shared< WORK_THREAD >(
						std::move(lock_factory) );

				thread->start();
				so_5::details::do_with_rollback_on_exception(
						[&] { m_agent_threads[ &agent ] = thread; },
						[&thread] { shutdown_and_wait( *thread ); } );

				return thread->get_agent_binding();
			}